

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterValidator.cpp
# Opt level: O1

Result * CoreML::validateInt64Parameter
                   (Result *__return_storage_ptr__,string *parameterName,
                   Int64Parameter *int64Parameter,bool shouldBePositive)

{
  Int64Range *pIVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  char cVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  ulong uVar11;
  size_type *psVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong *puVar16;
  ulong __val;
  uint uVar17;
  ulong *puVar18;
  bool bVar19;
  bool bVar20;
  string err;
  string __str;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  uint local_4c;
  ulong *local_48;
  Result *local_40;
  ulong local_38;
  
  uVar10 = CONCAT71(in_register_00000009,shouldBePositive) ^ 1;
  uVar14 = int64Parameter->defaultvalue_;
  cVar9 = (char)uVar10;
  lVar4 = (long)uVar14 >> 0x3f;
  cVar3 = (char)((long)uVar14 >> 0x3f);
  if ((long)uVar14 < 1 && cVar9 == '\0') {
    uVar10 = -uVar14;
    if (0 < (long)uVar14) {
      uVar10 = uVar14;
    }
    uVar17 = 1;
    if (9 < uVar10) {
      uVar14 = uVar10;
      uVar5 = 4;
      do {
        uVar17 = uVar5;
        if (uVar14 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0032efd9;
        }
        if (uVar14 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0032efd9;
        }
        if (uVar14 < 10000) goto LAB_0032efd9;
        bVar19 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        uVar5 = uVar17 + 4;
      } while (bVar19);
      uVar17 = uVar17 + 1;
    }
LAB_0032efd9:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar17 - cVar3);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_70._M_dataplus._M_p + -lVar4,uVar17,uVar10);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3de1b3);
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_90.field_2._M_allocated_capacity = *psVar12;
      local_90.field_2._8_8_ = plVar7[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar12;
      local_90._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_90._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_d0.field_2._M_allocated_capacity = *psVar12;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar12;
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0.field_2._8_8_ = plVar7[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0.field_2._8_8_ = plVar7[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_f0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
  }
  else if (int64Parameter->_oneof_case_[0] == 10) {
    pIVar1 = (int64Parameter->AllowedValues_).range_;
    lVar15 = pIVar1->minvalue_;
    if (lVar15 < 1 && cVar9 == '\0') {
      uVar14 = pIVar1->minvalue_;
      uVar10 = -uVar14;
      if (0 < (long)uVar14) {
        uVar10 = uVar14;
      }
      uVar17 = 1;
      if (9 < uVar10) {
        uVar13 = uVar10;
        uVar5 = 4;
        do {
          uVar17 = uVar5;
          if (uVar13 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_0032f3ba;
          }
          if (uVar13 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_0032f3ba;
          }
          if (uVar13 < 10000) goto LAB_0032f3ba;
          bVar19 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          uVar5 = uVar17 + 4;
        } while (bVar19);
        uVar17 = uVar17 + 1;
      }
LAB_0032f3ba:
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_70,(char)uVar17 - (char)((long)uVar14 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_70._M_dataplus._M_p + -((long)uVar14 >> 0x3f),uVar17,uVar10);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3de1eb);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_90.field_2._M_allocated_capacity = *psVar12;
        local_90.field_2._8_8_ = plVar7[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar12;
        local_90._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_90._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_d0.field_2._M_allocated_capacity = *psVar12;
        local_d0.field_2._8_8_ = plVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar12;
        local_d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_b0.field_2._M_allocated_capacity = *psVar12;
        local_b0.field_2._8_8_ = plVar7[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar12;
        local_b0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      psVar12 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_f0.field_2._M_allocated_capacity = *psVar12;
        local_f0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar12;
        local_f0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_f0._M_string_length = puVar8[1];
      *puVar8 = psVar12;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
    }
    else {
      lVar2 = pIVar1->maxvalue_;
      if (lVar2 < 1 && cVar9 == '\0') {
        uVar14 = pIVar1->maxvalue_;
        uVar10 = -uVar14;
        if (0 < (long)uVar14) {
          uVar10 = uVar14;
        }
        uVar17 = 1;
        if (9 < uVar10) {
          uVar13 = uVar10;
          uVar5 = 4;
          do {
            uVar17 = uVar5;
            if (uVar13 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_0032f5ed;
            }
            if (uVar13 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_0032f5ed;
            }
            if (uVar13 < 10000) goto LAB_0032f5ed;
            bVar19 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar17 + 4;
          } while (bVar19);
          uVar17 = uVar17 + 1;
        }
LAB_0032f5ed:
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_70,(char)uVar17 - (char)((long)uVar14 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_70._M_dataplus._M_p + -((long)uVar14 >> 0x3f),uVar17,uVar10);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3de223);
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_90.field_2._M_allocated_capacity = *psVar12;
          local_90.field_2._8_8_ = plVar7[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar12;
          local_90._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_90._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0.field_2._8_8_ = plVar7[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_d0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_b0.field_2._M_allocated_capacity = *psVar12;
          local_b0.field_2._8_8_ = plVar7[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar12;
          local_b0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_b0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        psVar12 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_f0.field_2._M_allocated_capacity = *psVar12;
          local_f0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar12;
          local_f0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_f0._M_string_length = puVar8[1];
        *puVar8 = psVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
      }
      else {
        if (lVar15 <= (long)uVar14 && (long)uVar14 <= lVar2) {
          if (lVar15 <= lVar2) goto LAB_0032f394;
          std::__cxx11::to_string(&local_70,uVar14);
          std::operator+(&local_90,"Specified minimum value (",&local_70);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
          psVar12 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_d0.field_2._M_allocated_capacity = *psVar12;
            local_d0.field_2._8_8_ = plVar7[3];
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar12;
            local_d0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_d0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::operator+(&local_b0,&local_d0,parameterName);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
          psVar12 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_f0.field_2._M_allocated_capacity = *psVar12;
            local_f0.field_2._8_8_ = puVar8[3];
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar12;
            local_f0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_f0._M_string_length = puVar8[1];
          *puVar8 = psVar12;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
            return __return_storage_ptr__;
          }
          goto LAB_0032f203;
        }
        uVar10 = -uVar14;
        if (0 < (long)uVar14) {
          uVar10 = uVar14;
        }
        uVar17 = 1;
        if (9 < uVar10) {
          uVar14 = uVar10;
          uVar5 = 4;
          do {
            uVar17 = uVar5;
            if (uVar14 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_0032fb56;
            }
            if (uVar14 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_0032fb56;
            }
            if (uVar14 < 10000) goto LAB_0032fb56;
            bVar19 = 99999 < uVar14;
            uVar14 = uVar14 / 10000;
            uVar5 = uVar17 + 4;
          } while (bVar19);
          uVar17 = uVar17 + 1;
        }
LAB_0032fb56:
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar17 - cVar3);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_70._M_dataplus._M_p + -lVar4,uVar17,uVar10);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3de1a9);
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_90.field_2._M_allocated_capacity = *psVar12;
          local_90.field_2._8_8_ = plVar7[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar12;
          local_90._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_90._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0.field_2._8_8_ = plVar7[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar12;
          local_d0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_d0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_b0.field_2._M_allocated_capacity = *psVar12;
          local_b0.field_2._8_8_ = plVar7[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar12;
          local_b0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_b0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        psVar12 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_f0.field_2._M_allocated_capacity = *psVar12;
          local_f0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar12;
          local_f0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_f0._M_string_length = puVar8[1];
        *puVar8 = psVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
      }
    }
  }
  else {
    if (int64Parameter->_oneof_case_[0] != 0xb) {
LAB_0032f394:
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    lVar15 = (long)(((int64Parameter->AllowedValues_).set_)->values_).current_size_;
    if (lVar15 == 0) {
      bVar20 = true;
      bVar19 = true;
    }
    else {
      puVar18 = (ulong *)(((int64Parameter->AllowedValues_).set_)->values_).arena_or_elements_;
      puVar16 = puVar18 + lVar15;
      uVar13 = 0;
      local_4c = (uint)uVar10;
      local_48 = puVar16;
      local_40 = __return_storage_ptr__;
      do {
        iVar6 = 0;
        if (*puVar18 == uVar14) {
          iVar6 = 2;
          bVar19 = false;
          uVar13 = CONCAT71((int7)(uVar13 >> 8),1);
        }
        else {
          bVar19 = true;
          if ((long)*puVar18 < 1 && (char)uVar10 == '\0') {
            uVar10 = *puVar18;
            __val = -uVar10;
            if (0 < (long)uVar10) {
              __val = uVar10;
            }
            uVar17 = 1;
            if (9 < __val) {
              uVar11 = __val;
              uVar5 = 4;
              do {
                uVar17 = uVar5;
                if (uVar11 < 100) {
                  uVar17 = uVar17 - 2;
                  goto LAB_0032ec0d;
                }
                if (uVar11 < 1000) {
                  uVar17 = uVar17 - 1;
                  goto LAB_0032ec0d;
                }
                if (uVar11 < 10000) goto LAB_0032ec0d;
                bVar19 = 99999 < uVar11;
                uVar11 = uVar11 / 10000;
                uVar5 = uVar17 + 4;
              } while (bVar19);
              uVar17 = uVar17 + 1;
            }
LAB_0032ec0d:
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            local_38 = uVar13;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_70,(char)uVar17 - (char)((long)uVar10 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (local_70._M_dataplus._M_p + -((long)uVar10 >> 0x3f),uVar17,__val);
            plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3de164);
            __return_storage_ptr__ = local_40;
            psVar12 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_90.field_2._M_allocated_capacity = *psVar12;
              local_90.field_2._8_8_ = plVar7[3];
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            }
            else {
              local_90.field_2._M_allocated_capacity = *psVar12;
              local_90._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_90._M_string_length = plVar7[1];
            *plVar7 = (long)psVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
            psVar12 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_d0.field_2._M_allocated_capacity = *psVar12;
              local_d0.field_2._8_8_ = plVar7[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar12;
              local_d0._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_d0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            psVar12 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_b0.field_2._M_allocated_capacity = *psVar12;
              local_b0.field_2._8_8_ = plVar7[3];
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar12;
              local_b0._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_b0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            psVar12 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_f0.field_2._M_allocated_capacity = *psVar12;
              local_f0.field_2._8_8_ = plVar7[3];
            }
            else {
              local_f0.field_2._M_allocated_capacity = *psVar12;
              local_f0._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_f0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            iVar6 = 1;
            bVar19 = false;
            uVar10 = (ulong)local_4c;
            puVar16 = local_48;
            uVar13 = local_38;
          }
        }
        if (!bVar19) goto LAB_0032eea2;
        puVar18 = puVar18 + 1;
      } while (puVar18 != puVar16);
      iVar6 = 2;
LAB_0032eea2:
      bVar19 = iVar6 == 2;
      bVar20 = (uVar13 & 1) == 0;
    }
    if (!bVar19) {
      return __return_storage_ptr__;
    }
    if (!bVar20) goto LAB_0032f394;
    uVar10 = -uVar14;
    if (0 < (long)uVar14) {
      uVar10 = uVar14;
    }
    uVar17 = 1;
    if (9 < uVar10) {
      uVar14 = uVar10;
      uVar5 = 4;
      do {
        uVar17 = uVar5;
        if (uVar14 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0032f811;
        }
        if (uVar14 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0032f811;
        }
        if (uVar14 < 10000) goto LAB_0032f811;
        bVar19 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        uVar5 = uVar17 + 4;
      } while (bVar19);
      uVar17 = uVar17 + 1;
    }
LAB_0032f811:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar17 - cVar3);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_70._M_dataplus._M_p + -lVar4,uVar17,uVar10);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3de1a9);
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_90.field_2._M_allocated_capacity = *psVar12;
      local_90.field_2._8_8_ = plVar7[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar12;
      local_90._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_90._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_d0.field_2._M_allocated_capacity = *psVar12;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar12;
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0.field_2._8_8_ = plVar7[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar12 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0.field_2._8_8_ = puVar8[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_f0._M_string_length = puVar8[1];
    *puVar8 = psVar12;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
    return __return_storage_ptr__;
  }
LAB_0032f203:
  operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result CoreML::validateInt64Parameter(const std::string& parameterName, const Specification::Int64Parameter& int64Parameter, bool shouldBePositive) {

    const ::google::protobuf::int64 defaultValue = int64Parameter.defaultvalue();

    if (shouldBePositive) {
        if (defaultValue <= 0) {
            std::string err = "Default Value (" + std::to_string(defaultValue) + ") for '" + parameterName + "' expected to be a positive value.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }

    if (int64Parameter.has_set()) {
        bool valueFoundInSet = false;
        for (const auto &value : int64Parameter.set().values()) {
            if (value == defaultValue) {
                valueFoundInSet = true;
                break;
            }
            if (value <= 0 && shouldBePositive) {
                std::string err = "Non-positive value (" + std::to_string(value) + ") in Allowed Values Set for '" + parameterName + "' is not allowed.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
        }
        if (false == valueFoundInSet) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") not found in Allowed Values Set for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }
    else if (int64Parameter.has_range()) {
        const Specification::Int64Range& range = int64Parameter.range();

        if (range.minvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive min value (" + std::to_string(range.minvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.maxvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive max value (" + std::to_string(range.maxvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (defaultValue < range.minvalue() || defaultValue > range.maxvalue()) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") out of Allowed Value Range for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.minvalue() > range.maxvalue()) {
            std::string err = "Specified minimum value (" + std::to_string(defaultValue) + ") greater than maximum value for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);

        }
    }

    return Result();
}